

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O3

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::set_graph_from_OFF
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  remove_edges(this,&this->one_skeleton);
  if (*(size_t *)
       ((long)&(this->one_skeleton_OFF).m_graph.super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>_>
               ._M_impl._M_node + 0x10) != 0) {
    boost::
    adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>
    ::operator=(&(this->one_skeleton).m_graph,&(this->one_skeleton_OFF).m_graph);
    (this->one_skeleton).m_parent = (this->one_skeleton_OFF).m_parent;
    (this->one_skeleton).m_edge_counter = (this->one_skeleton_OFF).m_edge_counter;
    std::__cxx11::
    list<boost::subgraph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>*,std::allocator<boost::subgraph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>*>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<boost::subgraph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>*>>
              ((list<boost::subgraph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>*,std::allocator<boost::subgraph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>*>>
                *)&(this->one_skeleton).m_children,
               (this->one_skeleton_OFF).m_children.
               super__List_base<boost::subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>_*,_std::allocator<boost::subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>_*>_>
               ._M_impl._M_node.super__List_node_base._M_next,&(this->one_skeleton_OFF).m_children);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(this->one_skeleton).m_global_vertex,&(this->one_skeleton_OFF).m_global_vertex);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::operator=(&(this->one_skeleton).m_local_vertex._M_t,
                &(this->one_skeleton_OFF).m_local_vertex._M_t);
    std::
    vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::operator=(&(this->one_skeleton).m_global_edge,&(this->one_skeleton_OFF).m_global_edge);
    std::
    _Rb_tree<int,_std::pair<const_int,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::_Select1st<std::pair<const_int,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
    ::operator=(&(this->one_skeleton).m_local_edge._M_t,&(this->one_skeleton_OFF).m_local_edge._M_t)
    ;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No triangulation read in OFF file!",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void set_graph_from_OFF() {
    remove_edges(one_skeleton);
    if (num_edges(one_skeleton_OFF))
      one_skeleton = one_skeleton_OFF;
    else
      std::cerr << "No triangulation read in OFF file!" << std::endl;
  }